

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_of_12,int a_max_of_12)

{
  int iVar1;
  ImVec2 *__src;
  ImVec2 *__dest;
  int iVar2;
  int iVar3;
  
  if (radius < 0.5) {
    iVar3 = (this->_Path).Size;
    iVar1 = (this->_Path).Capacity;
    if (iVar3 == iVar1) {
      iVar3 = iVar3 + 1;
      if (iVar1 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar1 / 2 + iVar1;
      }
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      if (iVar1 < iVar3) {
        __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar3 << 3);
        __src = (this->_Path).Data;
        if (__src != (ImVec2 *)0x0) {
          memcpy(__dest,__src,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = __dest;
        (this->_Path).Capacity = iVar3;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
    return;
  }
  _PathArcToFastEx(this,center,radius,a_min_of_12 << 2,a_max_of_12 << 2,0);
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& center, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }
    _PathArcToFastEx(center, radius, a_min_of_12 * IM_DRAWLIST_ARCFAST_SAMPLE_MAX / 12, a_max_of_12 * IM_DRAWLIST_ARCFAST_SAMPLE_MAX / 12, 0);
}